

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

bool pstore::http::
     check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                        io,frame *wsp,opcode *op,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  pointer puVar1;
  bool bVar2;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  opcode oVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  span<const_unsigned_char,__1L> *in_R9;
  error_code eVar5;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eo3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_68;
  span<unsigned_char_const,_1l> local_58 [16];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_48;
  
  if (wsp->fin == true) {
    oVar3 = *op;
    if (oVar3 == text) {
      pvVar4 = payload;
      bVar2 = is_valid_utf8<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      if (!bVar2) {
        send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                  (&local_48,(http *)sender,
                   (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                    *)io._M_data,
                   (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                    )0x3ef,(close_status_code)pvVar4);
        error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
        ::~error_or(&local_48);
        return false;
      }
      oVar3 = *op;
    }
    local_68 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (payload);
    pstore::gsl::span<unsigned_char_const,-1l>::span<unsigned_char,_1l>
              (local_58,(span<unsigned_char,__1L> *)&local_68);
    io_00._M_data._4_4_ = 0;
    io_00._M_data._0_4_ = oVar3;
    send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&eo3,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,io_00,(opcode)local_58,in_R9);
    if (eo3.has_error_ == true) {
      eVar5 = error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
              ::get_error(&eo3);
      (**(code **)(*(long *)eVar5._M_cat + 0x20))(&local_88,eVar5._M_cat,eVar5._M_value);
      log<std::__cxx11::string>(error,"Send error: ",&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    puVar1 = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    *op = unknown;
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&eo3);
  }
  return true;
}

Assistant:

bool check_message_complete (Sender const sender, IO const io, frame const & wsp,
                                     opcode & op, std::vector<std::uint8_t> & payload) {
            if (wsp.fin) {
                // We've got the complete message. If this was a text message, we need to
                // validate the UTF-8 that it contains.
                //
                // "When an endpoint is to interpret a byte stream as UTF-8 but finds that
                // the byte stream is not, in fact, a valid UTF-8 stream, that endpoint MUST
                // _Fail the WebSocket Connection_.
                if (op == opcode::text &&
                    !is_valid_utf8 (std::begin (payload), std::end (payload))) {

                    send_close_frame (sender, io, close_status_code::invalid_payload);
                    return false;
                }

                if (log_received_messages) {
                    std::string str;
                    std::transform (std::begin (payload), std::end (payload),
                                    std::back_inserter (str),
                                    [] (std::uint8_t const v) { return static_cast<char> (v); });
                    log (logger::priority::info, "Received: ", str);
                }

                // This implements a simple echo server ATM.
                error_or<IO> const eo3 = send_message (sender, io, op, gsl::make_span (payload));
                if (!eo3) {
                    log (logger::priority::error, "Send error: ", eo3.get_error ().message ());
                }

                payload.clear ();
                op = opcode::unknown;
            }
            return true;
        }